

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

Var Js::JavascriptNumber::EntryToFixed(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  double dVar9;
  double fractionDigitsRaw;
  Var aFractionDigits;
  undefined1 local_a8 [3];
  bool isFractionDigitsInfinite;
  int fractionDigits;
  CallInfo local_98;
  Var result;
  double value;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_34;
  TypeId local_28;
  TypeId typeId;
  TypeId typeId_1;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x26b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  value = (double)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x26e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)value,-0x7ff5ec3c,L"Number.prototype.toFixed");
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x274,"(args.Info.Count > 0)","negative arg count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar4 = GetThisValue(pvVar7,(double *)&result);
  if (BVar4 == 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
    if (pvVar7 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(pvVar7);
    if (bVar2) {
      local_28 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = Is_NoTaggedIntCheck(pvVar7);
      if (bVar2) {
        local_28 = TypeIds_Number;
      }
      else {
        pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
        if (pRVar8 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_28 = RecyclableObject::GetTypeId(pRVar8);
        if ((0x57 < (int)local_28) && (BVar4 = RecyclableObject::IsExternal(pRVar8), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (local_28 == TypeIds_HostDispatch) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
      Arguments::Arguments((Arguments *)local_a8,(Arguments *)&scriptContext);
      iVar3 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar8,EntryToFixed,local_a8,&local_98);
      if (iVar3 != 0) {
        return (Var)local_98;
      }
    }
    JavascriptError::ThrowTypeError((ScriptContext *)value,-0x7ff5ec3c,L"Number.prototype.toFixed");
  }
  aFractionDigits._4_4_ = 0;
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = TaggedInt::Is(pvVar7);
    if (bVar2) {
      aFractionDigits._4_4_ = TaggedInt::ToInt32(pvVar7);
    }
    else {
      if (pvVar7 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = TaggedInt::Is(pvVar7);
      if (bVar2) {
        local_34 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = Is_NoTaggedIntCheck(pvVar7);
        if (bVar2) {
          local_34 = TypeIds_Number;
        }
        else {
          pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
          if (pRVar8 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_34 = RecyclableObject::GetTypeId(pRVar8);
          if ((0x57 < (int)local_34) && (BVar4 = RecyclableObject::IsExternal(pRVar8), BVar4 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr();
            *puVar6 = 0;
          }
        }
      }
      if (local_34 != TypeIds_Undefined) {
        dVar9 = JavascriptConversion::ToInteger(pvVar7,(ScriptContext *)value);
        aFractionDigits._4_4_ = (int32)dVar9;
      }
    }
  }
  if ((-1 < aFractionDigits._4_4_) && (aFractionDigits._4_4_ < 0x15)) {
    BVar4 = IsNan((double)result);
    if (BVar4 == 0) {
      if ((1e+21 <= (double)result) || ((double)result <= -1e+21)) {
        callInfo_local = (CallInfo)ToStringRadix10((double)result,(ScriptContext *)value);
      }
      else {
        callInfo_local =
             (CallInfo)
             FormatDoubleToString
                       ((double)result,FormatFixed,aFractionDigits._4_4_,(ScriptContext *)value);
      }
    }
    else {
      callInfo_local = (CallInfo)ToStringNan((ScriptContext *)value);
    }
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowRangeError((ScriptContext *)value,-0x7ff5ec5e,(PCWSTR)0x0);
}

Assistant:

Var JavascriptNumber::EntryToFixed(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toFixed"));
        }
        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToFixed is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToFixed, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toFixed"));
        }
        int fractionDigits = 0;
        bool isFractionDigitsInfinite = false;
        if(args.Info.Count > 1)
        {
            //use the first arg as the fraction digits, ignore the rest.
            Var aFractionDigits = args[1];

            // shortcut for tagged int's
            if(TaggedInt::Is(aFractionDigits))
            {
                fractionDigits = TaggedInt::ToInt32(aFractionDigits);
            }
            else if(JavascriptOperators::GetTypeId(aFractionDigits) == TypeIds_Undefined)
            {
                // fraction digits = 0
            }
            else
            {
                double fractionDigitsRaw = JavascriptConversion::ToInteger(aFractionDigits, scriptContext);
                isFractionDigitsInfinite =
                    fractionDigitsRaw == JavascriptNumber::NEGATIVE_INFINITY ||
                    fractionDigitsRaw == JavascriptNumber::POSITIVE_INFINITY;
                fractionDigits = (int)fractionDigitsRaw;
            }
        }

        if (fractionDigits < 0 || fractionDigits > 20)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FractionOutOfRange);
        }

        if(IsNan(value))
        {
            return ToStringNan(scriptContext);
        }
        if(value >= 1e21 || value <= -1e21)
        {
            return ToStringRadix10(value, scriptContext);
        }

        return FormatDoubleToString(value, NumberUtilities::FormatFixed, fractionDigits, scriptContext);

    }